

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall cppcms::application::attach(application *this,application *app)

{
  application *local_18;
  
  local_18 = app;
  std::vector<cppcms::application_*,_std::allocator<cppcms::application_*>_>::push_back
            (&((this->d).ptr_)->managed_children,&local_18);
  add(this,local_18);
  return;
}

Assistant:

void application::attach(application *app)
{
	d->managed_children.push_back(app);
	add(*app);
}